

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::receiveCap
          (RpcConnectionState *this,Reader descriptor,ArrayPtr<kj::OwnFd> fds)

{
  Reader ops_00;
  byte bVar1;
  bool bVar2;
  Which WVar3;
  uint32_t uVar4;
  ulong uVar5;
  size_t sVar6;
  OwnFd *pOVar7;
  ClientHook *pCVar8;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> *this_00;
  RefOrVoid<capnp::ClientHook> hook;
  RpcClient *pRVar9;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  RefOrVoid<capnp::AnyPointer::Reader> reader;
  Own<capnp::PipelineHook,_std::nullptr_t> *pOVar10;
  PipelineHook *pPVar11;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar12;
  Maybe<kj::OwnFd> *pMVar13;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *pOVar14;
  ClientHook *extraout_RDX;
  ImportId importId;
  RpcConnectionState *params_00;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar15;
  StringPtr reason;
  StringPtr reason_00;
  undefined4 in_stack_fffffffffffffba8;
  undefined1 isPromise;
  undefined4 in_stack_fffffffffffffbac;
  Fault local_318;
  Fault f_1;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> local_2f0;
  undefined1 local_2e0 [32];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> vine_1;
  Reader tph;
  Own<capnp::ClientHook,_std::nullptr_t> local_278;
  undefined1 local_268 [64];
  undefined1 local_228 [8];
  Own<capnp::ClientHook,_std::nullptr_t> result_1;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  Array<capnp::PipelineOp> ops;
  Own<capnp::PipelineHook,_std::nullptr_t> *pipeline;
  Own<capnp::PipelineHook,_std::nullptr_t> *_pipeline2152;
  Answer *answer;
  undefined8 local_1b0;
  Answer *_answer2151;
  Reader promisedAnswer;
  Own<capnp::ClientHook,_std::nullptr_t> local_168;
  undefined1 local_158 [48];
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> local_128;
  undefined1 local_118 [40];
  RpcConnectionState *vineConnection;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> vine;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> *contact;
  undefined8 local_c0;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> *_contact2127;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *vineInfo;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *_vineInfo2126;
  Own<capnp::ClientHook,_std::nullptr_t> result;
  Export *exp;
  undefined8 local_88;
  Export *_exp2124;
  undefined1 local_78 [24];
  undefined1 local_60 [52];
  Maybe<kj::OwnFd> fd;
  uint fdIndex;
  RpcConnectionState *this_local;
  ArrayPtr<kj::OwnFd> fds_local;
  
  this_local = (RpcConnectionState *)fds.size_;
  params_00 = (RpcConnectionState *)fds.ptr;
  unique0x10001081 = params_00;
  fds_local.size_ = (size_t)this;
  bVar1 = rpc::CapDescriptor::Reader::getAttachedFd(&descriptor);
  fd.ptr._0_4_ = ZEXT14(bVar1);
  kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)(local_60 + 0x2c));
  uVar5 = (ulong)(uint)fd.ptr._0_4_;
  sVar6 = kj::ArrayPtr<kj::OwnFd>::size((ArrayPtr<kj::OwnFd> *)&this_local);
  if (uVar5 < sVar6) {
    pOVar7 = kj::ArrayPtr<kj::OwnFd>::operator[]
                       ((ArrayPtr<kj::OwnFd> *)&this_local,(ulong)(uint)fd.ptr._0_4_);
    bVar2 = kj::OwnFd::operator==(pOVar7,(void *)0x0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pOVar7 = kj::ArrayPtr<kj::OwnFd>::operator[]
                         ((ArrayPtr<kj::OwnFd> *)&this_local,(ulong)(uint)fd.ptr._0_4_);
      pOVar7 = kj::mv<kj::OwnFd>(pOVar7);
      kj::Maybe<kj::OwnFd>::operator=((Maybe<kj::OwnFd> *)(local_60 + 0x2c),pOVar7);
    }
  }
  WVar3 = rpc::CapDescriptor::Reader::which(&descriptor);
  importId = (ImportId)fds.ptr;
  switch(WVar3) {
  case NONE:
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this);
    local_60._20_4_ = 1;
    break;
  case SENDER_HOSTED:
    uVar4 = rpc::CapDescriptor::Reader::getSenderHosted(&descriptor);
    pMVar13 = kj::mv<kj::Maybe<kj::OwnFd>>((Maybe<kj::OwnFd> *)(local_60 + 0x2c));
    kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)(local_78 + 0x10),pMVar13);
    import((RpcConnectionState *)local_60,importId,SUB41(uVar4,0),(Maybe<kj::OwnFd> *)0x0);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::
    Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
              ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               local_60);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               local_60);
    kj::Maybe<kj::OwnFd>::~Maybe((Maybe<kj::OwnFd> *)(local_78 + 0x10));
    local_60._20_4_ = 1;
    break;
  case SENDER_PROMISE:
    uVar4 = rpc::CapDescriptor::Reader::getSenderPromise(&descriptor);
    pMVar13 = kj::mv<kj::Maybe<kj::OwnFd>>((Maybe<kj::OwnFd> *)(local_60 + 0x2c));
    kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)&_exp2124,pMVar13);
    import((RpcConnectionState *)local_78,importId,SUB41(uVar4,0),(Maybe<kj::OwnFd> *)0x1);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::
    Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
              ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               local_78);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               local_78);
    kj::Maybe<kj::OwnFd>::~Maybe((Maybe<kj::OwnFd> *)&_exp2124);
    local_60._20_4_ = 1;
    break;
  case RECEIVER_HOSTED:
    rpc::CapDescriptor::Reader::getReceiverHosted(&descriptor);
    anon_unknown_18::ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>
    ::find((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)&exp,
           importId + 0x1b8);
    local_88 = kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Export>
                         ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Export_&> *)&exp);
    if ((DisposalResults *)local_88 == (DisposalResults *)0x0) {
      kj::StringPtr::StringPtr
                ((StringPtr *)&promisedAnswer._reader.nestingLimit,
                 "invalid \'receiverHosted\' export ID");
      reason.content.size_ = promisedAnswer._reader._40_8_;
      reason.content.ptr = (char *)&local_168;
      newBrokenCap(reason);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,&local_168);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_168);
      local_60._20_4_ = 1;
    }
    else {
      result.ptr = (ClientHook *)local_88;
      pCVar8 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                         ((Own<capnp::ClientHook,_std::nullptr_t> *)
                          &((DisposalResults *)local_88)->exception);
      (*pCVar8->_vptr_ClientHook[4])(&_vineInfo2126);
      vineInfo = kj::_::
                 readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,decltype(nullptr)>
                           ((Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>_>
                             *)&result.ptr[2].brand);
      if ((Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)vineInfo !=
          (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)0x0) {
        _contact2127 = (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)vineInfo;
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>::operator->
                  (vineInfo);
        kj::
        OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
        ::tryGet<kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                  ((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                    *)&contact);
        this_00 = kj::_::readMaybe<kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                            ((Maybe<kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_&> *)&contact
                            );
        local_c0 = this_00;
        if (this_00 != (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)0x0) {
          hook = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*
                           ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126);
          f.exception._6_1_ = isSameNetwork(params_00,hook);
          f.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f.exception + 6));
          bVar2 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f.exception + 7));
          if (!bVar2) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)&vine.ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x855,FAILED,"isSameNetwork(*result)","_kjCondition,",
                       (DebugExpression<bool> *)((long)&f.exception + 7));
            kj::_::Debug::Fault::fatal((Fault *)&vine.ptr);
          }
          kj::Own<capnp::ClientHook,_std::nullptr_t>::
          downcast<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&vineConnection);
          pRVar9 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::
                   operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                               *)&vineConnection);
          params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                             (&pRVar9->connectionState);
          local_118._32_8_ = params;
          reader = kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::operator*(this_00);
          clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>((capnp *)&local_128,reader);
          pOVar14 = kj::
                    mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                                *)&vineConnection);
          kj::
          refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                    ((kj *)local_118,params,&local_128,pOVar14);
          kj::Own<capnp::ClientHook,decltype(nullptr)>::
          Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,void>
                    ((Own<capnp::ClientHook,decltype(nullptr)> *)(local_118 + 0x10),
                     (Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
                      *)local_118);
          kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126,
                     (Own<capnp::ClientHook,_std::nullptr_t> *)(local_118 + 0x10));
          kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                    ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_118 + 0x10));
          kj::
          Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
          ::~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
                  *)local_118);
          kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::~Own(&local_128);
          kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
                    ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                     &vineConnection);
        }
      }
      kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126);
      unwrapIfSameConnection((RpcConnectionState *)(local_158 + 0x28),(ClientHook *)params_00);
      bVar2 = kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&>::operator==
                        ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)
                         (local_158 + 0x28));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pOVar12 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                            ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126);
        kj::
        refcounted<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((kj *)local_158,pOVar12);
        kj::Own<capnp::ClientHook,decltype(nullptr)>::
        Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,void>
                  ((Own<capnp::ClientHook,decltype(nullptr)> *)(local_158 + 0x10),
                   (Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>
                    *)local_158);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)(local_158 + 0x10));
        kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_158 + 0x10));
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>::
        ~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t> *
             )local_158);
      }
      pOVar12 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                          ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,pOVar12);
      local_60._20_4_ = 1;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&_vineInfo2126);
    }
    break;
  case RECEIVER_ANSWER:
    rpc::CapDescriptor::Reader::getReceiverAnswer((Reader *)&_answer2151,&descriptor);
    rpc::PromisedAnswer::Reader::getQuestionId((Reader *)&_answer2151);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)&answer
           ,importId + 0x2d8);
    local_1b0 = kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer>
                          ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer_&> *)&answer);
    if (((Answer *)local_1b0 == (Answer *)0x0) ||
       (pOVar10 = kj::_::readMaybe<capnp::PipelineHook,decltype(nullptr)>
                            ((Maybe<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)local_1b0),
       pOVar10 == (Own<capnp::PipelineHook,_std::nullptr_t> *)0x0)) {
      kj::StringPtr::StringPtr((StringPtr *)&tph._reader.nestingLimit,"invalid \'receiverAnswer\'");
      reason_00.content.size_ = tph._reader._40_8_;
      reason_00.content.ptr = (char *)&local_278;
      newBrokenCap(reason_00);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,&local_278);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_278);
      local_60._20_4_ = 1;
    }
    else {
      ops.disposer = (ArrayDisposer *)pOVar10;
      rpc::PromisedAnswer::Reader::getTransform((Reader *)&result_1.ptr,(Reader *)&_answer2151);
      ops_00.reader.capTable = (CapTableReader *)local_208;
      ops_00.reader.segment = (SegmentReader *)uStack_210;
      ops_00.reader.ptr = (byte *)uStack_200;
      ops_00.reader._24_8_ = local_1f8;
      ops_00.reader._32_8_ = uStack_1f0;
      ops_00.reader.nestingLimit = in_stack_fffffffffffffba8;
      ops_00.reader._44_4_ = in_stack_fffffffffffffbac;
      anon_unknown_18::toPipelineOps(ops_00);
      pPVar11 = kj::Own<capnp::PipelineHook,_std::nullptr_t>::operator->
                          ((Own<capnp::PipelineHook,_std::nullptr_t> *)ops.disposer);
      local_268._48_16_ = (undefined1  [16])kj::Array::operator_cast_to_ArrayPtr((Array *)local_1e8)
      ;
      (*pPVar11->_vptr_PipelineHook[1])(local_228,pPVar11,local_268._48_8_,local_268._56_8_);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_228);
      unwrapIfSameConnection((RpcConnectionState *)(local_268 + 0x28),(ClientHook *)params_00);
      bVar2 = kj::Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&>::operator==
                        ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)
                         (local_268 + 0x28));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        pOVar12 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                            ((Own<capnp::ClientHook,_std::nullptr_t> *)local_228);
        kj::
        refcounted<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((kj *)local_268,pOVar12);
        kj::Own<capnp::ClientHook,decltype(nullptr)>::
        Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,void>
                  ((Own<capnp::ClientHook,decltype(nullptr)> *)(local_268 + 0x10),
                   (Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>
                    *)local_268);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)local_228,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)(local_268 + 0x10));
        kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_268 + 0x10));
        kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t>::
        ~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::TribbleRaceBlocker,_std::nullptr_t> *
             )local_268);
      }
      pOVar12 = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                          ((Own<capnp::ClientHook,_std::nullptr_t> *)local_228);
      kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,pOVar12);
      local_60._20_4_ = 1;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_228);
      kj::Array<capnp::PipelineOp>::~Array((Array<capnp::PipelineOp> *)local_1e8);
    }
    break;
  case THIRD_PARTY_HOSTED:
    rpc::CapDescriptor::Reader::getThirdPartyHosted((Reader *)&vine_1.ptr,&descriptor);
    uVar4 = rpc::ThirdPartyCapDescriptor::Reader::getVineId((Reader *)&vine_1.ptr);
    isPromise = (undefined1)uVar4;
    pMVar13 = kj::mv<kj::Maybe<kj::OwnFd>>((Maybe<kj::OwnFd> *)(local_60 + 0x2c));
    kj::Maybe<kj::OwnFd>::Maybe((Maybe<kj::OwnFd> *)(local_2e0 + 0x10),pMVar13);
    import((RpcConnectionState *)(local_2e0 + 0x18),importId,(bool)isPromise,(Maybe<kj::OwnFd> *)0x0
          );
    kj::Maybe<kj::OwnFd>::~Maybe((Maybe<kj::OwnFd> *)(local_2e0 + 0x10));
    rpc::ThirdPartyCapDescriptor::Reader::getId((Reader *)&f_1,(Reader *)&vine_1.ptr);
    clone<capnp::AnyPointer::Reader,capnp::AnyPointer>((capnp *)&local_2f0,(Reader *)&f_1);
    pOVar14 = kj::
              mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                        ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                          *)(local_2e0 + 0x18));
    kj::
    refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
              ((kj *)local_2e0,params_00,&local_2f0,pOVar14);
    kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::
    Maybe<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient>
              ((Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)this,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
                *)local_2e0);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>::
    ~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t>
          *)local_2e0);
    kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::~Own(&local_2f0);
    local_60._20_4_ = 1;
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
               (local_2e0 + 0x18));
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              (&local_318,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x882,FAILED,(char *)0x0,"\"unknown CapDescriptor type\"",
               (char (*) [27])"unknown CapDescriptor type");
    kj::_::Debug::Fault::fatal(&local_318);
  }
  kj::Maybe<kj::OwnFd>::~Maybe((Maybe<kj::OwnFd> *)(local_60 + 0x2c));
  MVar15.ptr.ptr = extraout_RDX;
  MVar15.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar15.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> receiveCap(rpc::CapDescriptor::Reader descriptor,
                                            kj::ArrayPtr<kj::OwnFd> fds) {
    uint fdIndex = descriptor.getAttachedFd();
    kj::Maybe<kj::OwnFd> fd;
    if (fdIndex < fds.size() && fds[fdIndex] != nullptr) {
      fd = kj::mv(fds[fdIndex]);
    }

    switch (descriptor.which()) {
      case rpc::CapDescriptor::NONE:
        return kj::none;

      case rpc::CapDescriptor::SENDER_HOSTED:
        return import(descriptor.getSenderHosted(), false, kj::mv(fd));
      case rpc::CapDescriptor::SENDER_PROMISE:
        return import(descriptor.getSenderPromise(), true, kj::mv(fd));

      case rpc::CapDescriptor::RECEIVER_HOSTED:
        KJ_IF_SOME(exp, exports.find(descriptor.getReceiverHosted())) {
          auto result = exp.clientHook->addRef();
          KJ_IF_SOME(vineInfo, exp.vineInfo) {
            KJ_IF_SOME(contact, vineInfo->info.tryGet<VineInfo::Contact>()) {
              // This is a vine, and not the root of the vine. We previously forwarded a
              // three-party handoff to the peer, and the peer reflected it back to us. We need
              // to wrap this in a new `DeferredThirdPartyClient` so that if it is sent to yet
              // another party, it will be handed off correctly. If we just pass along the vine
              // itself, then three-party handoff will stop working.
              KJ_ASSERT(isSameNetwork(*result));
              kj::Own<RpcClient> vine = result.downcast<RpcClient>();
              auto& vineConnection = *vine->connectionState;
              result = kj::refcounted<DeferredThirdPartyClient>(
                  vineConnection, capnp::clone(*contact), kj::mv(vine));
            }
          }
          if (unwrapIfSameConnection(*result) != kj::none) {
            result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
          }
          return kj::mv(result);
        } else {
          return newBrokenCap("invalid 'receiverHosted' export ID");
        }

      case rpc::CapDescriptor::RECEIVER_ANSWER: {
        auto promisedAnswer = descriptor.getReceiverAnswer();

        KJ_IF_SOME(answer, answers.find(promisedAnswer.getQuestionId())) {
          KJ_IF_SOME(pipeline, answer.pipeline) {
            auto ops = toPipelineOps(promisedAnswer.getTransform());
            auto result = pipeline->getPipelinedCap(ops);
            if (unwrapIfSameConnection(*result) != kj::none) {
              result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
            }
            return kj::mv(result);
          }
        }

        return newBrokenCap("invalid 'receiverAnswer'");
      }

      case rpc::CapDescriptor::THIRD_PARTY_HOSTED: {
        // We need to connect to a third party to accept this capability.

        auto tph = descriptor.getThirdPartyHosted();

        // Import the vine first so that we're sure to drop it if anything goes wrong.
        auto vine = import(tph.getVineId(), false, kj::mv(fd));

        return kj::refcounted<DeferredThirdPartyClient>(
            *this, capnp::clone(tph.getId()), kj::mv(vine));
      }

      default:
        KJ_FAIL_REQUIRE("unknown CapDescriptor type");
        return newBrokenCap("unknown CapDescriptor type");
    }